

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_int>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QModelIndex,_int>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QModelIndex,_int>_> *old)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  quintptr qVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  pair<QModelIndex,_int> *ppVar9;
  pair<QModelIndex,_int> *ppVar10;
  pair<QModelIndex,_int> *ppVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QArrayDataPointer<std::pair<QModelIndex,_int>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar12 = QArrayData::reallocateUnaligned
                        (pQVar1,this->ptr,0x20,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 5),
                         Grow);
    this->d = (Data *)auVar12._0_8_;
    this->ptr = (pair<QModelIndex,_int> *)auVar12._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (pair<QModelIndex,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar8 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if (0 < lVar8) {
          ppVar10 = this->ptr;
          ppVar9 = ppVar10 + lVar8;
          ppVar11 = local_38.ptr + local_38.size;
          do {
            iVar6 = (ppVar10->first).r;
            iVar7 = (ppVar10->first).c;
            qVar3 = (ppVar10->first).i;
            iVar4 = ppVar10->second;
            uVar5 = *(undefined4 *)&ppVar10->field_0x1c;
            (ppVar11->first).m.ptr = (ppVar10->first).m.ptr;
            ppVar11->second = iVar4;
            *(undefined4 *)&ppVar11->field_0x1c = uVar5;
            (ppVar11->first).r = iVar6;
            (ppVar11->first).c = iVar7;
            (ppVar11->first).i = qVar3;
            ppVar10 = ppVar10 + 1;
            local_38.size = local_38.size + 1;
            ppVar11 = ppVar11 + 1;
          } while (ppVar10 < ppVar9);
        }
      }
      else if (0 < lVar8) {
        ppVar10 = this->ptr;
        ppVar9 = ppVar10 + lVar8;
        ppVar11 = local_38.ptr + local_38.size;
        do {
          iVar6 = (ppVar10->first).r;
          iVar7 = (ppVar10->first).c;
          qVar3 = (ppVar10->first).i;
          iVar4 = ppVar10->second;
          uVar5 = *(undefined4 *)&ppVar10->field_0x1c;
          (ppVar11->first).m.ptr = (ppVar10->first).m.ptr;
          ppVar11->second = iVar4;
          *(undefined4 *)&ppVar11->field_0x1c = uVar5;
          (ppVar11->first).r = iVar6;
          (ppVar11->first).c = iVar7;
          (ppVar11->first).i = qVar3;
          ppVar10 = ppVar10 + 1;
          local_38.size = local_38.size + 1;
          ppVar11 = ppVar11 + 1;
        } while (ppVar10 < ppVar9);
      }
    }
    pQVar1 = &this->d->super_QArrayData;
    this->d = local_38.d;
    ppVar10 = this->ptr;
    this->ptr = local_38.ptr;
    qVar2 = this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar1;
    local_38.ptr = ppVar10;
    local_38.size = qVar2;
    if (old != (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar1;
      local_38.ptr = old->ptr;
      old->ptr = ppVar10;
      local_38.size = old->size;
      old->size = qVar2;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x20,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }